

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ptrdiff_t _Num;
  ulong uVar7;
  char *buf_ptr;
  scoped_padder p;
  format_int fStack_78;
  scoped_padder local_58;
  
  if ((msg->source).line != 0) {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar2 = strlen((msg->source).filename);
      uVar1 = (msg->source).line;
      uVar4 = uVar1 | 1;
      uVar5 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (uVar5 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      sVar6 = sVar2 + ((uVar5 + 1) -
                      (uint)(uVar1 < *(uint *)(fmt::v6::internal::basic_data<void>::
                                               zero_or_powers_of_10_32 + (ulong)uVar5 * 4))) + 1;
    }
    else {
      sVar6 = 0;
    }
    scoped_padder::scoped_padder(&local_58,sVar6,&(this->super_flag_formatter).padinfo_,dest);
    pcVar3 = (msg->source).filename;
    sVar2 = strlen(pcVar3);
    if (pcVar3 != (char *)0x0) {
      uVar7 = (dest->super_buffer<char>).size_ + sVar2;
      if ((dest->super_buffer<char>).capacity_ < uVar7) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar7);
      }
      if (sVar2 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar3,sVar2);
      }
      (dest->super_buffer<char>).size_ = uVar7;
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar6 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar6 + 1;
    (dest->super_buffer<char>).ptr_[sVar6] = ':';
    uVar1 = (msg->source).line;
    uVar5 = -uVar1;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    pcVar3 = fmt::v6::format_int::format_decimal(&fStack_78,(ulong)uVar5);
    fStack_78.str_ = pcVar3;
    if ((int)uVar1 < 0) {
      fStack_78.str_ = pcVar3 + -1;
      pcVar3[-1] = '-';
    }
    pcVar3 = fStack_78.str_;
    sVar2 = (long)(fStack_78.buffer_ + 0x15) - (long)fStack_78.str_;
    uVar7 = (dest->super_buffer<char>).size_ + sVar2;
    if ((dest->super_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar7);
    }
    if (fStack_78.buffer_ + 0x15 != pcVar3) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar3,sVar2);
    }
    (dest->super_buffer<char>).size_ = uVar7;
    scoped_padder::~scoped_padder(&local_58);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}